

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap2.c
# Opt level: O3

void Cffgsfk(fitsfile *fptr,int colnum,int naxis,long *naxes,long *blc,long *trc,long *inc,
            int *array,int *flagval,int *anynul,int *status)

{
  char *flagval_00;
  size_t sVar1;
  size_t __size;
  ulong uVar2;
  
  if (naxis < 1) {
    __size = 1;
    flagval_00 = (char *)malloc(1);
  }
  else {
    __size = 1;
    uVar2 = 0;
    do {
      __size = __size * ((trc[uVar2] - blc[uVar2]) / inc[uVar2] + 1);
      uVar2 = uVar2 + 1;
    } while ((uint)naxis != uVar2);
    flagval_00 = (char *)malloc(__size);
    if ((long)__size < 1) {
      ffgsfk(fptr,colnum,naxis,naxes,blc,trc,inc,array,flagval_00,anynul,status);
      goto LAB_0015d4d7;
    }
  }
  sVar1 = 0;
  do {
    flagval_00[sVar1] = (char)flagval[sVar1];
    sVar1 = sVar1 + 1;
  } while (__size != sVar1);
  ffgsfk(fptr,colnum,naxis,naxes,blc,trc,inc,array,flagval_00,anynul,status);
  sVar1 = 0;
  do {
    flagval[sVar1] = (uint)(flagval_00[sVar1] != '\0');
    sVar1 = sVar1 + 1;
  } while (__size != sVar1);
LAB_0015d4d7:
  free(flagval_00);
  return;
}

Assistant:

void Cffgsfk( fitsfile *fptr, int colnum, int naxis, long *naxes, long *blc, long *trc, long *inc, int *array, int *flagval, int *anynul, int *status )
{
   char *Cflagval;
   long nflagval;
   int i;
 
   for( nflagval=1, i=0; i<naxis; i++ )
      nflagval *= (trc[i]-blc[i])/inc[i]+1;
   Cflagval = F2CcopyLogVect(nflagval, flagval );
   ffgsfk( fptr, colnum, naxis, naxes, blc, trc, inc, array, Cflagval, anynul, status );   
   C2FcopyLogVect(nflagval, flagval, Cflagval);
}